

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_global_decodeURI(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int isComponent)

{
  bool bVar1;
  int k;
  uint c;
  uint uVar2;
  JSValueUnion p;
  ulong uVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  JSValue v;
  StringBuffer local_50;
  
  v = JS_ToStringInternal(ctx,*argv,0);
  p = v.u;
  uVar5 = (uint)v.tag;
  if (uVar5 != 6) {
    local_50.len = 0;
    local_50.size = 0;
    local_50.is_wide_char = 0;
    local_50.error_status = 0;
    local_50.ctx = ctx;
    local_50.str = js_alloc_string(ctx,0,0);
    if (local_50.str == (JSString *)0x0) {
      local_50._16_8_ = local_50._16_8_ & 0xffffffff;
      local_50.error_status = -1;
    }
    uVar3 = *(ulong *)((long)p.ptr + 4);
    if ((uVar3 & 0x7fffffff) != 0) {
      iVar6 = 0;
      do {
        if ((int)uVar3 < 0) {
          c = (uint)*(ushort *)((long)p.ptr + (long)iVar6 * 2 + 0x10);
        }
        else {
          c = (uint)*(byte *)((long)p.ptr + (long)iVar6 + 0x10);
        }
        if (c == 0x25) {
          c = hex_decode(ctx,(JSString *)p.ptr,iVar6);
          if ((int)c < 0) goto LAB_001693b8;
          iVar7 = iVar6 + 3;
          if ((int)c < 0x80) {
            if (isComponent == 0) {
              pvVar4 = memchr(";/?:@&=+$,#",c,0xb);
              if (pvVar4 != (void *)0x0) {
                c = 0x25;
                iVar7 = iVar6 + 1;
              }
            }
            goto LAB_00169327;
          }
          if ((c & 0x7fffffe0) == 0xc0) {
            c = c & 0x1f;
            iVar6 = 0x80;
            iVar9 = 0;
LAB_0016929f:
            bVar1 = true;
          }
          else {
            if ((c & 0x7ffffff0) == 0xe0) {
              c = c & 0xf;
              iVar6 = 0x800;
              iVar9 = 1;
              goto LAB_0016929f;
            }
            if ((c & 0x7ffffff8) == 0xf0) {
              c = c & 7;
              iVar6 = 0x10000;
              iVar9 = 2;
              goto LAB_0016929f;
            }
            iVar6 = 1;
            iVar9 = -1;
            c = 0;
            bVar1 = false;
          }
          if (bVar1) {
            iVar9 = iVar9 + 1;
            do {
              k = iVar7;
              uVar2 = hex_decode(ctx,(JSString *)p.ptr,k);
              if ((int)uVar2 < 0) goto LAB_001693b8;
              if ((uVar2 & 0xc0) != 0x80) {
                c = 0;
                break;
              }
              c = c << 6 | uVar2 & 0x3f;
              iVar8 = iVar9 + -1;
              bVar1 = 0 < iVar9;
              iVar9 = iVar8;
              iVar7 = k + 3;
            } while (iVar8 != 0 && bVar1);
            iVar7 = k + 3;
          }
          if ((((int)c < iVar6) || (0x10ffff < (int)c)) || ((c & 0xfffff800) == 0xd800)) {
            js_throw_URIError(ctx,"malformed UTF-8");
LAB_001693b8:
            if ((0xfffffff4 < uVar5) && (iVar6 = *p.ptr, *(int *)p.ptr = iVar6 + -1, iVar6 < 2)) {
              __JS_FreeValueRT(ctx->rt,v);
            }
            (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
            return (JSValue)(ZEXT816(6) << 0x40);
          }
        }
        else {
          iVar7 = iVar6 + 1;
        }
LAB_00169327:
        iVar6 = iVar7;
        string_buffer_putc(&local_50,c);
        uVar3 = *(ulong *)((long)p.ptr + 4);
      } while (iVar6 < (int)((uint)uVar3 & 0x7fffffff));
    }
    if ((0xfffffff4 < uVar5) && (iVar6 = *p.ptr, *(int *)p.ptr = iVar6 + -1, iVar6 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
    v = string_buffer_end(&local_50);
  }
  return v;
}

Assistant:

static JSValue js_global_decodeURI(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv, int isComponent)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int k, c, c1, n, c_min;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    string_buffer_init(ctx, b, 0);

    p = JS_VALUE_GET_STRING(str);
    for (k = 0; k < p->len;) {
        c = string_get(p, k);
        if (c == '%') {
            c = hex_decode(ctx, p, k);
            if (c < 0)
                goto fail;
            k += 3;
            if (c < 0x80) {
                if (!isComponent && isURIReserved(c)) {
                    c = '%';
                    k -= 2;
                }
            } else {
                /* Decode URI-encoded UTF-8 sequence */
                if (c >= 0xc0 && c <= 0xdf) {
                    n = 1;
                    c_min = 0x80;
                    c &= 0x1f;
                } else if (c >= 0xe0 && c <= 0xef) {
                    n = 2;
                    c_min = 0x800;
                    c &= 0xf;
                } else if (c >= 0xf0 && c <= 0xf7) {
                    n = 3;
                    c_min = 0x10000;
                    c &= 0x7;
                } else {
                    n = 0;
                    c_min = 1;
                    c = 0;
                }
                while (n-- > 0) {
                    c1 = hex_decode(ctx, p, k);
                    if (c1 < 0)
                        goto fail;
                    k += 3;
                    if ((c1 & 0xc0) != 0x80) {
                        c = 0;
                        break;
                    }
                    c = (c << 6) | (c1 & 0x3f);
                }
                if (c < c_min || c > 0x10FFFF ||
                    (c >= 0xd800 && c < 0xe000)) {
                    js_throw_URIError(ctx, "malformed UTF-8");
                    goto fail;
                }
            }
        } else {
            k++;
        }
        string_buffer_putc(b, c);
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    JS_FreeValue(ctx, str);
    string_buffer_free(b);
    return JS_EXCEPTION;
}